

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

void __thiscall QMimeData::setUrls(QMimeData *this,QList<QUrl> *urls)

{
  QMimeDataPrivate *this_00;
  const_iterator i1;
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  QVariant local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  textUriListLiteral();
  i1.i = (urls->d).ptr;
  QList<QVariant>::QList<QList<QUrl>::const_iterator,_true>
            ((QList<QVariant> *)&QStack_68,i1,i1.i + (urls->d).size);
  ::QVariant::QVariant(&local_38,(QList<QVariant> *)&QStack_68);
  QMimeDataPrivate::setData(this_00,(QString *)&local_50,&local_38);
  ::QVariant::~QVariant(&local_38);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&QStack_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setUrls(const QList<QUrl> &urls)
{
    Q_D(QMimeData);
    d->setData(textUriListLiteral(), QList<QVariant>(urls.cbegin(), urls.cend()));
}